

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pztransfer.h
# Opt level: O2

void __thiscall
TPZTransfer<std::complex<float>_>::TPZTransfer
          (TPZTransfer<std::complex<float>_> *this,void **vtt,TPZTransfer<std::complex<float>_> *cp)

{
  int64_t iVar1;
  char cVar2;
  
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)vtt[3];
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)vtt[2];
  iVar1 = (cp->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol;
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow =
       (cp->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow;
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol = iVar1;
  cVar2 = (cp->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fDefPositive;
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fDecomposed =
       (cp->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fDecomposed;
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fDefPositive = cVar2;
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)vtt[1];
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)*vtt;
  *(undefined4 *)&(this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.field_0x1c =
       *(undefined4 *)&(cp->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.field_0x1c;
  TPZBlock::TPZBlock(&this->fRowBlock,&cp->fRowBlock);
  TPZBlock::TPZBlock(&this->fColBlock,&cp->fColBlock);
  TPZVec<int>::TPZVec(&this->fColPosition,&cp->fColPosition);
  TPZVec<int>::TPZVec(&this->fNumberofColumnBlocks,&cp->fNumberofColumnBlocks);
  TPZManVector<int,_10>::TPZManVector(&this->fColumnBlockPosition,0);
  TPZManVector<int,_10>::TPZManVector(&this->fColumnBlockNumber,&cp->fColumnBlockNumber);
  this->fColumnBlockLastUsed = cp->fColumnBlockLastUsed;
  TPZManVector<std::complex<float>,_10>::TPZManVector(&this->fDoubleValues,&cp->fDoubleValues);
  this->fDoubleValLastUsed = cp->fDoubleValLastUsed;
  return;
}

Assistant:

TPZTransfer(const TPZTransfer &cp) : TPZRegisterClassId(&TPZTransfer::ClassId),
    TPZMatrix<TVar>(cp),
	fNTVarVar(cp.fNTVarVar), fRowBlock(cp.fRowBlock),
	fColBlock(cp.fColBlock),fColPosition(cp.fColPosition),
	fNumberofColumnBlocks(cp.fNumberofColumnBlocks),
	fColumnBlockNumber(cp.fColumnBlockNumber),
	fColumnBlockLastUsed(cp.fColumnBlockLastUsed),
	fDoubleValues(cp.fDoubleValues),
	fDoubleValLastUsed(cp.fDoubleValLastUsed)
	{
	}